

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O3

TransactionStructApiBase * __thiscall
cfd::js::api::TransactionStructApiBase::
ConvertSignDataStructToSignParameter<cfd::js::api::PubkeySignDataStruct>
          (TransactionStructApiBase *this,PubkeySignDataStruct *sign_data)

{
  bool is_rangeproof;
  bool bVar1;
  bool bVar2;
  int iVar3;
  SignDataType SVar4;
  undefined1 local_a8 [32];
  _func_int *local_88 [3];
  ByteData local_70;
  TransactionStructApiBase local_54 [12];
  TransactionStructApiBase local_48 [12];
  SigHashType local_3c [12];
  
  iVar3 = std::__cxx11::string::compare((char *)&sign_data->type);
  if (iVar3 == 0) {
    if (sign_data->der_encode != true) {
      cfd::core::SigHashType::SigHashType(local_3c,kSigHashAll,false,false);
      cfd::SignParameter::SignParameter((SignParameter *)this,sign_data,0,local_3c);
      return this;
    }
    bVar1 = sign_data->sighash_anyone_can_pay;
    bVar2 = sign_data->sighash_rangeproof;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    ConvertSigHashType(local_48,&sign_data->sighash_type,bVar1,bVar2,false,(string *)local_a8);
    cfd::SignParameter::SignParameter((SignParameter *)this,sign_data,1,local_48);
    local_a8._16_8_ = local_a8._0_8_;
    if ((undefined1 *)local_a8._0_8_ == local_a8 + 0x10) {
      return this;
    }
  }
  else {
    SVar4 = ConvertToSignDataType(&sign_data->type);
    switch(SVar4) {
    case kSign:
      cfd::core::ByteData::ByteData(&local_70,(string *)sign_data);
      bVar1 = sign_data->der_encode;
      bVar2 = sign_data->sighash_anyone_can_pay;
      is_rangeproof = sign_data->sighash_rangeproof;
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
      ConvertSigHashType(local_54,&sign_data->sighash_type,bVar2,is_rangeproof,false,
                         (string *)local_a8);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_70,bVar1,local_54);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_);
      }
      break;
    default:
      cfd::core::ByteData::ByteData((ByteData *)local_a8,(string *)sign_data);
      cfd::SignParameter::SignParameter((SignParameter *)this,(ByteData *)local_a8);
      local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
      break;
    case kPubkey:
      cfd::core::Pubkey::Pubkey((Pubkey *)local_a8,(string *)sign_data);
      cfd::SignParameter::SignParameter((SignParameter *)this,(Pubkey *)local_a8);
      local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
      break;
    case kRedeemScript:
      cfd::core::Script::Script((Script *)local_a8,(string *)sign_data);
      cfd::SignParameter::SignParameter((SignParameter *)this,(Script *)local_a8);
      core::Script::~Script((Script *)local_a8);
      return this;
    case kOpCode:
      cfd::core::ScriptOperator::Get((string *)local_a8);
      cfd::SignParameter::SignParameter((SignParameter *)this,(ScriptOperator *)local_a8);
      local_a8._0_8_ = &PTR__ScriptOperator_00a86a00;
      if ((_func_int **)local_a8._16_8_ == local_88) {
        return this;
      }
      goto LAB_00781d15;
    }
    local_a8._16_8_ =
         local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    if ((_func_int **)
        local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (_func_int **)0x0) {
      return this;
    }
  }
LAB_00781d15:
  operator_delete((void *)local_a8._16_8_);
  return this;
}

Assistant:

SignParameter TransactionStructApiBase::ConvertSignDataStructToSignParameter(
    const SignStructClass& sign_data) {
  if (sign_data.type == "auto") {
    // insert text directly
    if (sign_data.der_encode) {
      return SignParameter(
          sign_data.hex, sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    } else {
      return SignParameter(sign_data.hex);
    }
  }
  SignDataType data_type = ConvertToSignDataType(sign_data.type);
  switch (data_type) {
    case kSign:
      return SignParameter(
          ByteData(sign_data.hex), sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    case kOpCode:
      return SignParameter(ScriptOperator::Get(sign_data.hex));
    case kPubkey:
      return SignParameter(Pubkey(sign_data.hex));
    case kRedeemScript:
      return SignParameter(Script(sign_data.hex));
    case kBinary:
      // fall-through
    default:
      return SignParameter(ByteData(sign_data.hex));
  }
}